

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_nl.h
# Opt level: O2

void __thiscall
ExampleNLFeeder::
FeedConBounds<mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ConBndWriter>
          (ExampleNLFeeder *this,ConBndWriter *cbw)

{
  AlgConRange acr;
  long lVar1;
  
  for (lVar1 = -0x18; lVar1 != 0; lVar1 = lVar1 + 8) {
    acr.U = (double)*(undefined8 *)((long)this->mdl_->con_name + lVar1);
    acr.L = (double)*(undefined8 *)((long)this->mdl_->con_ub + lVar1);
    acr.k = 0;
    acr.cvar = 0;
    mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,ExampleNLFeeder>>::ConBndWriter::
    WriteAlgConRange<mp::NLFeeder<ExampleModel,void*>::AlgConRange>((ConBndWriter *)cbw,acr);
  }
  return;
}

Assistant:

void FeedConBounds(ConBoundsWriter& cbw) {
    for (int j=0; j<Model().n_con; j++) {
      AlgConRange bnd;
      bnd.L = Model().con_lb[j];
      bnd.U = Model().con_ub[j];
      cbw.WriteAlgConRange(bnd);
    }
  }